

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O2

int ncnn::binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_add>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  uint uVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  ulong uVar5;
  float *pfVar6;
  int iVar7;
  float *pfVar8;
  float *pfVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  
  uVar1 = a->c;
  iVar7 = a->h * a->w * a->d * a->elempack;
  Mat::create_like(c,a,opt->blob_allocator);
  iVar10 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    uVar15 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar15 = 0;
    }
    for (uVar5 = 0; uVar5 != uVar15; uVar5 = uVar5 + 1) {
      pvVar2 = a->data;
      pvVar3 = b->data;
      pvVar4 = c->data;
      lVar13 = a->elemsize * a->cstep * uVar5;
      lVar12 = b->elemsize * b->cstep * uVar5;
      lVar11 = c->elemsize * c->cstep * uVar5;
      lVar14 = 0;
      for (iVar10 = 0; iVar10 + 0xf < iVar7; iVar10 = iVar10 + 0x10) {
        auVar16 = vaddps_avx512f(*(undefined1 (*) [64])((long)pvVar3 + lVar14 + lVar12),
                                 *(undefined1 (*) [64])((long)pvVar2 + lVar14 + lVar13));
        *(undefined1 (*) [64])((long)pvVar4 + lVar14 + lVar11) = auVar16;
        lVar14 = lVar14 + 0x40;
      }
      for (; iVar10 + 7 < iVar7; iVar10 = iVar10 + 8) {
        pfVar6 = (float *)((long)pvVar3 + lVar14 + lVar12);
        pfVar8 = (float *)((long)pvVar2 + lVar14 + lVar13);
        auVar18._0_4_ = *pfVar6 + *pfVar8;
        auVar18._4_4_ = pfVar6[1] + pfVar8[1];
        auVar18._8_4_ = pfVar6[2] + pfVar8[2];
        auVar18._12_4_ = pfVar6[3] + pfVar8[3];
        auVar18._16_4_ = pfVar6[4] + pfVar8[4];
        auVar18._20_4_ = pfVar6[5] + pfVar8[5];
        auVar18._24_4_ = pfVar6[6] + pfVar8[6];
        auVar18._28_4_ = pfVar6[7] + pfVar8[7];
        *(undefined1 (*) [32])((long)pvVar4 + lVar14 + lVar11) = auVar18;
        lVar14 = lVar14 + 0x20;
      }
      for (; iVar10 + 3 < iVar7; iVar10 = iVar10 + 4) {
        pfVar6 = (float *)((long)pvVar3 + lVar14 + lVar12);
        pfVar8 = (float *)((long)pvVar2 + lVar14 + lVar13);
        auVar17._0_4_ = *pfVar6 + *pfVar8;
        auVar17._4_4_ = pfVar6[1] + pfVar8[1];
        auVar17._8_4_ = pfVar6[2] + pfVar8[2];
        auVar17._12_4_ = pfVar6[3] + pfVar8[3];
        *(undefined1 (*) [16])((long)pvVar4 + lVar14 + lVar11) = auVar17;
        lVar14 = lVar14 + 0x10;
      }
      pfVar6 = (float *)((long)pvVar2 + lVar13 + lVar14);
      pfVar8 = (float *)((long)pvVar3 + lVar12 + lVar14);
      pfVar9 = (float *)((long)pvVar4 + lVar11 + lVar14);
      for (; iVar10 < iVar7; iVar10 = iVar10 + 1) {
        *pfVar9 = *pfVar8 + *pfVar6;
        pfVar6 = pfVar6 + 1;
        pfVar8 = pfVar8 + 1;
        pfVar9 = pfVar9 + 1;
      }
    }
    iVar10 = 0;
  }
  return iVar10;
}

Assistant:

static int binary_op_7_13_19_29(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 7 13 19 29
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}